

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O1

void __thiscall
helics::NetworkCommsInterface::setFlag(NetworkCommsInterface *this,string_view flag,bool val)

{
  bool bVar1;
  int iVar2;
  size_type __rlen;
  
  if (flag._M_len == 0xd) {
    iVar2 = bcmp(flag._M_str,"noack_connect",0xd);
    if (iVar2 == 0) {
      bVar1 = CommsInterface::propertyLock(&this->super_CommsInterface);
      if (!bVar1) {
        return;
      }
      this->noAckConnection = val;
LAB_002cc14c:
      CommsInterface::propertyUnLock(&this->super_CommsInterface);
      return;
    }
  }
  else if ((flag._M_len == 7) && (iVar2 = bcmp(flag._M_str,"os_port",7), iVar2 == 0)) {
    bVar1 = CommsInterface::propertyLock(&this->super_CommsInterface);
    if (!bVar1) {
      return;
    }
    this->useOsPortAllocation = val;
    goto LAB_002cc14c;
  }
  CommsInterface::setFlag(&this->super_CommsInterface,flag,val);
  return;
}

Assistant:

void NetworkCommsInterface::setFlag(std::string_view flag, bool val)
{
    if (flag == "os_port") {
        if (propertyLock()) {
            useOsPortAllocation = val;
            propertyUnLock();
        }
    } else if (flag == "noack_connect") {
        if (propertyLock()) {
            noAckConnection = val;
            propertyUnLock();
        }
    } else {
        CommsInterface::setFlag(flag, val);
    }
}